

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<QSslError>::insert
          (QMovableArrayOps<QSslError> *this,qsizetype i,qsizetype n,parameter_type t)

{
  long lVar1;
  uint uVar2;
  undefined8 in_RCX;
  GrowthPosition where;
  QArrayDataPointer<QSslError> *in_RDX;
  long in_RSI;
  Inserter *in_RDI;
  long in_FS_OFFSET;
  bool bVar3;
  GrowthPosition pos;
  bool growsAtBegin;
  QSslError copy;
  qsizetype in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  undefined1 uVar4;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  uint uVar5;
  QArrayDataPointer<QSslError> *pQVar6;
  
  where = (GrowthPosition)((ulong)in_RCX >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QSslError::QSslError
            ((QSslError *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
             (QSslError *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
  bVar3 = in_RDI->displaceTo != (QSslError *)0x0;
  uVar4 = bVar3 && in_RSI == 0;
  uVar5 = CONCAT13(uVar4,(int3)in_stack_ffffffffffffffa4);
  uVar2 = (uint)(bVar3 && in_RSI == 0);
  QArrayDataPointer<QSslError>::detachAndGrow
            (in_RDX,where,CONCAT44(uVar5,uVar2),
             (QSslError **)CONCAT17(uVar4,in_stack_ffffffffffffff98),
             (QArrayDataPointer<QSslError> *)in_RDI);
  if ((uVar5 & 0x1000000) == 0) {
    Inserter::Inserter((Inserter *)CONCAT44(uVar5,uVar2),
                       (QArrayDataPointer<QSslError> *)CONCAT17(uVar4,in_stack_ffffffffffffff98),
                       (qsizetype)in_RDI,in_stack_ffffffffffffff88);
    Inserter::insertFill
              ((Inserter *)CONCAT44(uVar5,uVar2),
               (QSslError *)CONCAT17(uVar4,in_stack_ffffffffffffff98),(qsizetype)in_RDI);
    Inserter::~Inserter(in_RDI);
  }
  else {
    while (pQVar6 = (QArrayDataPointer<QSslError> *)((long)&in_RDX[-1].size + 7),
          in_RDX != (QArrayDataPointer<QSslError> *)0x0) {
      QArrayDataPointer<QSslError>::begin((QArrayDataPointer<QSslError> *)0x39c8d2);
      QSslError::QSslError
                ((QSslError *)CONCAT44(uVar5,uVar2),
                 (QSslError *)CONCAT17(uVar4,in_stack_ffffffffffffff98));
      in_RDI->displaceFrom = in_RDI->displaceFrom + -1;
      in_RDI->displaceTo =
           (QSslError *)
           ((long)&(in_RDI->displaceTo->d)._M_t.
                   super___uniq_ptr_impl<QSslErrorPrivate,_std::default_delete<QSslErrorPrivate>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_QSslErrorPrivate_*,_std::default_delete<QSslErrorPrivate>_>
                   .super__Head_base<0UL,_QSslErrorPrivate_*,_false>._M_head_impl + 1);
      in_RDX = pQVar6;
    }
  }
  QSslError::~QSslError((QSslError *)0x39c945);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void insert(qsizetype i, qsizetype n, parameter_type t)
    {
        T copy(t);

        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, n, nullptr, nullptr);
        Q_ASSERT((pos == Data::GrowsAtBeginning && this->freeSpaceAtBegin() >= n) ||
                 (pos == Data::GrowsAtEnd && this->freeSpaceAtEnd() >= n));

        if (growsAtBegin) {
            // copy construct items in reverse order at the begin
            Q_ASSERT(this->freeSpaceAtBegin() >= n);
            while (n--) {
                new (this->begin() - 1) T(copy);
                --this->ptr;
                ++this->size;
            }
        } else {
            Inserter(this, i, n).insertFill(copy, n);
        }
    }